

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void writeHorizontal(double **U,int sizeX,int sizeY,char *fileName)

{
  FILE *__stream;
  ulong uVar1;
  ulong uVar2;
  
  __stream = fopen(fileName,"w");
  fputc(0x5b,__stream);
  uVar2 = 0;
  uVar1 = (ulong)(uint)sizeY;
  if (sizeY < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    fprintf(__stream,"%g,",U[(long)(sizeX / 2) + 2][uVar2 + 1]);
  }
  fputc(0x5d,__stream);
  fclose(__stream);
  return;
}

Assistant:

void writeHorizontal (REAL **U, int sizeX, int sizeY, char *fileName)
{
	FILE *out = fopen(fileName,"w");
	fprintf(out,"[");
	for (int j = 1; j <= sizeY; j++)
		fprintf(out,"%g,",U[2+sizeX/2][j]);
	fprintf(out,"]");
	fclose(out);
	return;
}